

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test1(void)

{
  ostream *poVar1;
  vector<int,_std::allocator<int>_> *__range1;
  int *x;
  int *piVar2;
  vector<int,_std::allocator<int>_> v;
  Queue q;
  
  CP::queue<int>::queue(&q);
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ = 1
  ;
  CP::queue<int>::push(&q,(int *)&v);
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ = 2
  ;
  CP::queue<int>::push(&q,(int *)&v);
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ = 3
  ;
  CP::queue<int>::push(&q,(int *)&v);
  CP::queue<int>::to_vector(&v,&q,2);
  for (piVar2 = (int *)CONCAT44(v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      piVar2 != v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  CP::queue<int>::~queue(&q);
  return true;
}

Assistant:

bool test1() {
  Queue q;
  q.push(1);
  q.push(2);
  q.push(3);
  vector<int> v = q.to_vector(2);
  for (auto &x : v) {
    cout << x << " ";
  }
  cout << endl;

  return true;
}